

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RWBBlock.h
# Opt level: O0

pair<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>
 __thiscall dg::dda::RWBBlock::splitAround(RWBBlock *this,NodeT *node)

{
  bool bVar1;
  size_type sVar2;
  reference ppRVar3;
  iterator this_00;
  reference ppRVar4;
  RWNode *in_RDX;
  __uniq_ptr_data<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>,_true,_true>
  extraout_RDX;
  tuple<dg::dda::RWBBlock_*,_std::default_delete<dg::dda::RWBBlock>_> extraout_RDX_00;
  __uniq_ptr_impl<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_> _Var5;
  RWBBlock *in_RSI;
  unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_> in_RDI;
  pair<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>
  pVar6;
  RWBBlock **p;
  iterator __end3;
  iterator __begin3;
  EdgesT *__range3;
  RWBBlock *s;
  iterator __end2;
  iterator __begin2;
  EdgesT *__range2;
  RWBBlock *bbwithsuccessors;
  iterator et;
  iterator it;
  uint num;
  RWBBlock *after;
  RWBBlock *withnode;
  RWNode *in_stack_ffffffffffffff28;
  RWNode *in_stack_ffffffffffffff30;
  RWNode *in_stack_ffffffffffffff38;
  _Head_base<0UL,_dg::dda::RWBBlock_*,_false> this_01;
  size_type in_stack_ffffffffffffff58;
  list<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *in_stack_ffffffffffffff60;
  __normal_iterator<dg::dda::RWBBlock_**,_std::vector<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>_>
  local_88;
  EdgesT *local_80;
  RWBBlock *in_stack_ffffffffffffff88;
  __normal_iterator<dg::dda::RWBBlock_**,_std::vector<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>_>
  local_68;
  ElemWithEdges<dg::dda::RWBBlock> *local_60;
  RWNode *local_58;
  _Self local_50;
  _Self local_48;
  int local_3c;
  undefined8 local_38;
  undefined8 local_30;
  RWNode *local_28;
  RWNode *local_20;
  RWNode *local_18;
  
  local_20 = (RWNode *)0x0;
  local_28 = (RWNode *)0x0;
  this_01._M_head_impl =
       (RWBBlock *)
       in_RDI._M_t.super___uniq_ptr_impl<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>
       ._M_t.super__Tuple_impl<0UL,_dg::dda::RWBBlock_*,_std::default_delete<dg::dda::RWBBlock>_>.
       super__Head_base<0UL,_dg::dda::RWBBlock_*,_false>._M_head_impl;
  local_18 = in_RDX;
  BBlockBase<dg::dda::RWBBlock,dg::dda::RWNode>::getNodes_abi_cxx11_
            ((BBlockBase<dg::dda::RWBBlock,dg::dda::RWNode> *)in_RSI);
  sVar2 = std::__cxx11::list<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::size
                    ((list<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)0x16d65e);
  if (sVar2 == 1) {
    local_30 = 0;
    local_38 = 0;
    std::
    pair<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>
    ::pair<std::nullptr_t,_std::nullptr_t,_true>
              ((pair<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>
                *)this_01._M_head_impl,&in_stack_ffffffffffffff38->_vptr_RWNode,
               &in_stack_ffffffffffffff30->_vptr_RWNode);
    _Var5._M_t.super__Tuple_impl<0UL,_dg::dda::RWBBlock_*,_std::default_delete<dg::dda::RWBBlock>_>.
    super__Head_base<0UL,_dg::dda::RWBBlock_*,_false>._M_head_impl =
         (tuple<dg::dda::RWBBlock_*,_std::default_delete<dg::dda::RWBBlock>_>)
         (tuple<dg::dda::RWBBlock_*,_std::default_delete<dg::dda::RWBBlock>_>)
         extraout_RDX.
         super___uniq_ptr_impl<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>._M_t.
         super__Tuple_impl<0UL,_dg::dda::RWBBlock_*,_std::default_delete<dg::dda::RWBBlock>_>.
         super__Head_base<0UL,_dg::dda::RWBBlock_*,_false>._M_head_impl;
  }
  else {
    local_3c = 0;
    BBlockBase<dg::dda::RWBBlock,dg::dda::RWNode>::getNodes_abi_cxx11_
              ((BBlockBase<dg::dda::RWBBlock,dg::dda::RWNode> *)in_RSI);
    local_48._M_node =
         (_List_node_base *)
         std::__cxx11::list<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::begin
                   ((list<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)
                    in_stack_ffffffffffffff28);
    BBlockBase<dg::dda::RWBBlock,dg::dda::RWNode>::getNodes_abi_cxx11_
              ((BBlockBase<dg::dda::RWBBlock,dg::dda::RWNode> *)in_RSI);
    local_50._M_node =
         (_List_node_base *)
         std::__cxx11::list<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::end
                   ((list<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)
                    in_stack_ffffffffffffff28);
    while ((bVar1 = std::operator!=(&local_48,&local_50), bVar1 &&
           (ppRVar3 = std::_List_iterator<dg::dda::RWNode_*>::operator*
                                ((_List_iterator<dg::dda::RWNode_*> *)0x16d702),
           *ppRVar3 != local_18))) {
      local_3c = local_3c + 1;
      std::_List_iterator<dg::dda::RWNode_*>::operator++(&local_48);
    }
    std::_List_iterator<dg::dda::RWNode_*>::operator++(&local_48);
    bVar1 = std::operator!=(&local_48,&local_50);
    if (bVar1) {
      in_stack_ffffffffffffff38 = (RWNode *)operator_new(0x58);
      RWBBlock((RWBBlock *)in_stack_ffffffffffffff30,(RWSubgraph *)in_stack_ffffffffffffff28);
      local_28 = in_stack_ffffffffffffff38;
      while (bVar1 = std::operator!=(&local_48,&local_50), bVar1) {
        in_stack_ffffffffffffff30 = local_28;
        std::_List_iterator<dg::dda::RWNode_*>::operator*
                  ((_List_iterator<dg::dda::RWNode_*> *)0x16d7be);
        BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>::append
                  ((BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode> *)in_stack_ffffffffffffff30,
                   in_stack_ffffffffffffff28);
        std::_List_iterator<dg::dda::RWNode_*>::operator++(&local_48);
      }
    }
    if (local_3c == 0) {
      BBlockBase<dg::dda::RWBBlock,dg::dda::RWNode>::getNodes_abi_cxx11_
                ((BBlockBase<dg::dda::RWBBlock,dg::dda::RWNode> *)in_RSI);
      std::__cxx11::list<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::resize
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    }
    else {
      in_stack_ffffffffffffff28 = (RWNode *)operator_new(0x58);
      RWBBlock((RWBBlock *)in_stack_ffffffffffffff30,(RWSubgraph *)in_stack_ffffffffffffff28);
      local_20 = in_stack_ffffffffffffff28;
      BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>::append
                ((BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode> *)in_stack_ffffffffffffff30,
                 in_stack_ffffffffffffff28);
      BBlockBase<dg::dda::RWBBlock,dg::dda::RWNode>::getNodes_abi_cxx11_
                ((BBlockBase<dg::dda::RWBBlock,dg::dda::RWNode> *)in_RSI);
      std::__cxx11::list<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::resize
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    }
    local_58 = local_28;
    if (local_28 == (RWNode *)0x0) {
      local_58 = local_20;
    }
    local_60 = &(in_RSI->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
                super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>;
    local_68._M_current =
         (RWBBlock **)
         std::vector<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>::begin
                   ((vector<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_> *)
                    in_stack_ffffffffffffff28);
    this_00 = std::vector<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>::end
                        ((vector<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_> *)
                         in_stack_ffffffffffffff28);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<dg::dda::RWBBlock_**,_std::vector<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>_>
                               *)in_stack_ffffffffffffff30,
                              (__normal_iterator<dg::dda::RWBBlock_**,_std::vector<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>_>
                               *)in_stack_ffffffffffffff28), bVar1) {
      ppRVar4 = __gnu_cxx::
                __normal_iterator<dg::dda::RWBBlock_**,_std::vector<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>_>
                ::operator*(&local_68);
      in_stack_ffffffffffffff88 = *ppRVar4;
      local_80 = &(in_stack_ffffffffffffff88->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
                  super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>.
                  _predecessors;
      local_88._M_current =
           (RWBBlock **)
           std::vector<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>::begin
                     ((vector<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_> *)
                      in_stack_ffffffffffffff28);
      std::vector<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>::end
                ((vector<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_> *)
                 in_stack_ffffffffffffff28);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<dg::dda::RWBBlock_**,_std::vector<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>_>
                                 *)in_stack_ffffffffffffff30,
                                (__normal_iterator<dg::dda::RWBBlock_**,_std::vector<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>_>
                                 *)in_stack_ffffffffffffff28), bVar1) {
        ppRVar4 = __gnu_cxx::
                  __normal_iterator<dg::dda::RWBBlock_**,_std::vector<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>_>
                  ::operator*(&local_88);
        if (*ppRVar4 == in_RSI) {
          *ppRVar4 = (RWBBlock *)local_58;
        }
        __gnu_cxx::
        __normal_iterator<dg::dda::RWBBlock_**,_std::vector<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>_>
        ::operator++(&local_88);
      }
      __gnu_cxx::
      __normal_iterator<dg::dda::RWBBlock_**,_std::vector<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>_>
      ::operator++(&local_68);
    }
    std::vector<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>::swap
              ((vector<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_> *)
               this_01._M_head_impl,
               (vector<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_> *)
               in_stack_ffffffffffffff38);
    if (local_20 == (RWNode *)0x0) {
      ElemWithEdges<dg::dda::RWBBlock>::addSuccessor
                ((ElemWithEdges<dg::dda::RWBBlock> *)this_00._M_current,in_stack_ffffffffffffff88);
    }
    else {
      ElemWithEdges<dg::dda::RWBBlock>::addSuccessor
                ((ElemWithEdges<dg::dda::RWBBlock> *)this_00._M_current,in_stack_ffffffffffffff88);
      if (local_28 != (RWNode *)0x0) {
        ElemWithEdges<dg::dda::RWBBlock>::addSuccessor
                  ((ElemWithEdges<dg::dda::RWBBlock> *)this_00._M_current,in_stack_ffffffffffffff88)
        ;
      }
    }
    std::unique_ptr<dg::dda::RWBBlock,std::default_delete<dg::dda::RWBBlock>>::
    unique_ptr<std::default_delete<dg::dda::RWBBlock>,void>
              ((unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_> *)
               in_stack_ffffffffffffff30,(pointer)in_stack_ffffffffffffff28);
    std::unique_ptr<dg::dda::RWBBlock,std::default_delete<dg::dda::RWBBlock>>::
    unique_ptr<std::default_delete<dg::dda::RWBBlock>,void>
              ((unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_> *)
               in_stack_ffffffffffffff30,(pointer)in_stack_ffffffffffffff28);
    std::
    pair<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>
    ::
    pair<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_true>
              ((pair<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>
                *)this_01._M_head_impl,
               (unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_> *)
               in_stack_ffffffffffffff38,
               (unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_> *)
               in_stack_ffffffffffffff30);
    std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>::~unique_ptr
              ((unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_> *)
               in_stack_ffffffffffffff30);
    std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>::~unique_ptr
              ((unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_> *)
               in_stack_ffffffffffffff30);
    _Var5._M_t.super__Tuple_impl<0UL,_dg::dda::RWBBlock_*,_std::default_delete<dg::dda::RWBBlock>_>.
    super__Head_base<0UL,_dg::dda::RWBBlock_*,_false>._M_head_impl =
         (tuple<dg::dda::RWBBlock_*,_std::default_delete<dg::dda::RWBBlock>_>)
         (tuple<dg::dda::RWBBlock_*,_std::default_delete<dg::dda::RWBBlock>_>)
         extraout_RDX_00.
         super__Tuple_impl<0UL,_dg::dda::RWBBlock_*,_std::default_delete<dg::dda::RWBBlock>_>.
         super__Head_base<0UL,_dg::dda::RWBBlock_*,_false>._M_head_impl;
  }
  pVar6.second._M_t.
  super___uniq_ptr_impl<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>._M_t.
  super__Tuple_impl<0UL,_dg::dda::RWBBlock_*,_std::default_delete<dg::dda::RWBBlock>_>.
  super__Head_base<0UL,_dg::dda::RWBBlock_*,_false>._M_head_impl =
       (__uniq_ptr_data<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>,_true,_true>)
       (__uniq_ptr_data<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>,_true,_true>)
       _Var5._M_t.
       super__Tuple_impl<0UL,_dg::dda::RWBBlock_*,_std::default_delete<dg::dda::RWBBlock>_>.
       super__Head_base<0UL,_dg::dda::RWBBlock_*,_false>._M_head_impl;
  pVar6.first._M_t.super___uniq_ptr_impl<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>
  ._M_t.super__Tuple_impl<0UL,_dg::dda::RWBBlock_*,_std::default_delete<dg::dda::RWBBlock>_>.
  super__Head_base<0UL,_dg::dda::RWBBlock_*,_false>._M_head_impl =
       in_RDI._M_t.super___uniq_ptr_impl<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>
       ._M_t.super__Tuple_impl<0UL,_dg::dda::RWBBlock_*,_std::default_delete<dg::dda::RWBBlock>_>.
       super__Head_base<0UL,_dg::dda::RWBBlock_*,_false>._M_head_impl;
  return pVar6;
}

Assistant:

std::pair<std::unique_ptr<RWBBlock>, std::unique_ptr<RWBBlock>>
    splitAround(NodeT *node) {
        assert(node->getBBlock() == this && "Spliting a block on invalid node");

        RWBBlock *withnode = nullptr;
        RWBBlock *after = nullptr;

        if (getNodes().size() == 1) {
            assert(*getNodes().begin() == node);
            return {nullptr, nullptr};
        }

#ifndef NDEBUG
        auto old_size = getNodes().size();
        assert(old_size > 1);
#endif
        unsigned num = 0;
        auto it = getNodes().begin(), et = getNodes().end();
        for (; it != et; ++it) {
            if (*it == node) {
                break;
            }
            ++num;
        }

        assert(it != et && "Did not find the node");
        assert(*it == node);

        ++it;
        if (it != et) {
            after = new RWBBlock(subgraph);
            for (; it != et; ++it) {
                after->append(*it);
            }
        }

        // truncate nodes in this block
        if (num > 0) {
            withnode = new RWBBlock(subgraph);
            withnode->append(node);

            getNodes().resize(num);
        } else {
            assert(*getNodes().begin() == node);
            assert(after && "Should have a suffix");
            getNodes().resize(1);
        }

        assert(!withnode || withnode->size() == 1);
        assert(((getNodes().size() + (withnode ? withnode->size() : 0) +
                 (after ? after->size() : 0)) == old_size) &&
               "Bug in splitting nodes");

        // reconnect edges
        RWBBlock *bbwithsuccessors = after;
        if (!bbwithsuccessors) // no suffix
            bbwithsuccessors = withnode;

        assert(bbwithsuccessors);
        for (auto *s : this->_successors) {
            for (auto &p : s->_predecessors) {
                if (p == this) {
                    p = bbwithsuccessors;
                }
            }
        }
        // swap this and after successors
        bbwithsuccessors->_successors.swap(this->_successors);

        if (withnode) {
            this->addSuccessor(withnode);
            if (after) {
                withnode->addSuccessor(after);
            }
        } else {
            assert(after && "Should have a suffix");
            this->addSuccessor(after);
        }

        return {std::unique_ptr<RWBBlock>(withnode),
                std::unique_ptr<RWBBlock>(after)};
    }